

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_>
coro_io::
async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
          (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *socket,
          basic_streambuf<std::allocator<char>_> *buffer,size_t size_to_read)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 in_RCX;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:179:43)>
  *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:179:43)>
  cVar3;
  anon_class_24_3_96bdddb6 *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  LazyPromise<std::pair<std::error_code,_unsigned_long>_> *in_stack_fffffffffffffe48;
  
  puVar2 = (undefined8 *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = 
    async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
    ;
    puVar2[1] = 
    async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
    ;
    this = (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:179:43)>
            *)(puVar2 + 0x10);
    puVar2[0x14] = in_RSI;
    puVar2[0x15] = in_RDX;
    puVar2[0x16] = in_RCX;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object(in_stack_fffffffffffffe48);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xb9));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xb9));
      callback_awaitor<std::pair<std::error_code,_unsigned_long>_>::callback_awaitor
                ((callback_awaitor<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      puVar2[0xd] = puVar2[0x14];
      puVar2[0xe] = puVar2[0x15];
      puVar2[0xf] = puVar2 + 0x16;
      cVar3 = callback_awaitor_base<std::pair<std::error_code,unsigned_long>,coro_io::callback_awaitor<std::pair<std::error_code,unsigned_long>>>
              ::
              await_resume<coro_io::async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>(asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&,asio::basic_streambuf<std::allocator<char>>&,unsigned_long)::_lambda(auto:1)_1_>
                        ((callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28);
      *(callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:179:43)>
        *)(puVar2 + 0x12) = cVar3;
      cVar3 = async_simple::coro::detail::LazyPromiseBase::
              await_transform<coro_io::callback_awaitor_base<std::pair<std::error_code,unsigned_long>,coro_io::callback_awaitor<std::pair<std::error_code,unsigned_long>>>::callback_awaitor_impl<coro_io::async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>(asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&,asio::basic_streambuf<std::allocator<char>>&,unsigned_long)::_lambda(auto:1)_1_>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:179:43)>
                          *)in_stack_fffffffffffffe28);
      *this = cVar3;
      bVar1 = callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
              ::
              callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/press_tool/../include/cinatra/ylt/coro_io/coro_io.hpp:179:43)>
              ::await_ready(this);
      if (bVar1) {
        callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
        ::
        callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/press_tool/../include/cinatra/ylt/coro_io/coro_io.hpp:179:43)>
        ::await_resume(this);
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_>
                  ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (pair<std::error_code,_unsigned_long> *)in_stack_fffffffffffffe28);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0xba));
        if (bVar1) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xba));
          async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
          ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x186b3c);
          if (puVar2 != (undefined8 *)0x0) {
            operator_delete(puVar2,0xc0);
          }
        }
        else {
          *puVar2 = 0;
          async_read((void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (void *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          (*(code *)*extraout_RAX)(extraout_RAX);
        }
      }
      else {
        *(undefined1 *)(puVar2 + 0x17) = 1;
        async_read((void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (void *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
    }
    else {
      *(undefined1 *)(puVar2 + 0x17) = 0;
      async_read((void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (void *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

inline async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read(
    Socket &socket, AsioBuffer &buffer, size_t size_to_read) noexcept {
  callback_awaitor<std::pair<std::error_code, size_t>> awaitor;
  co_return co_await awaitor.await_resume([&](auto handler) {
    asio::async_read(socket, buffer, asio::transfer_exactly(size_to_read),
                     [&, handler](const auto &ec, auto size) {
                       handler.set_value_then_resume(ec, size);
                     });
  });
}